

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O2

int fiobj_hash_set(FIOBJ hash,FIOBJ key,FIOBJ obj)

{
  uint64_t hash_value;
  
  if (((uint)hash & 7) == 4) {
    if (((uint)key & 7) == 2) {
      fiobj_str_freeze(key);
    }
    hash_value = fiobj_obj2hash(key);
    fio_hash___insert((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8),hash_value,key,obj,
                      (FIOBJ *)0x0);
    fiobj_free(obj);
    return 0;
  }
  __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                ,200,"int fiobj_hash_set(FIOBJ, FIOBJ, FIOBJ)");
}

Assistant:

int fiobj_hash_set(FIOBJ hash, FIOBJ key, FIOBJ obj) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  if (FIOBJ_TYPE_IS(key, FIOBJ_T_STRING))
    fiobj_str_freeze(key);
  fio_hash___insert(&obj2hash(hash)->hash, fiobj_obj2hash(key), key, obj, NULL);
  fiobj_free(obj); /* take ownership - free the user's reference. */
  return 0;
}